

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManHighLightFlopLogic(Gia_Man_t *p)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  
  iVar3 = 0;
  while ((iVar3 < p->vCis->nSize - p->nRegs &&
         (pGVar2 = Gia_ManCi(p,iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    pGVar2->field_0x3 = pGVar2->field_0x3 & 0xbf;
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while ((iVar3 < p->nRegs &&
         (pGVar2 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    pGVar2->field_0x3 = pGVar2->field_0x3 | 0x40;
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while ((iVar3 < p->nObjs && (pGVar2 = Gia_ManObj(p,iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    uVar1 = *(ulong *)pGVar2;
    if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
      *(ulong *)pGVar2 =
           uVar1 & 0xffffffff3fffffff |
           (ulong)((*(uint *)(pGVar2 + -(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)) |
                   *(uint *)(pGVar2 + -(uVar1 & 0x1fffffff))) & 0x40000000);
    }
    iVar3 = iVar3 + 1;
  }
  iVar3 = 0;
  while( true ) {
    if (p->vCos->nSize <= iVar3) {
      return;
    }
    pGVar2 = Gia_ManCo(p,iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar2 =
         *(ulong *)pGVar2 & 0xffffffffbfffffff |
         (ulong)((uint)*(undefined8 *)(pGVar2 + -(ulong)((uint)*(ulong *)pGVar2 & 0x1fffffff)) &
                0x40000000);
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void Gia_ManHighLightFlopLogic( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark0 = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->fMark0 = 1;
    Gia_ManForEachAnd( p, pObj, i )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 | Gia_ObjFanin1(pObj)->fMark0;
    Gia_ManForEachCo( p, pObj, i )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0;
}